

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O2

void __thiscall Graph::dfsForDeterm(Graph *this,uint64_t v,uint64_t *timer,uint64_t backward)

{
  pointer pCVar1;
  uint64_t uVar2;
  pointer pvVar3;
  pointer puVar4;
  pointer pEVar5;
  pointer puVar6;
  ulong uVar7;
  ulong uVar8;
  pointer puVar9;
  uint64_t vertex;
  uint64_t local_40;
  uint64_t local_38;
  
  pCVar1 = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pCVar1[v] == White) {
    pCVar1[v] = Grey;
    uVar2 = *timer;
    *timer = uVar2 + 1;
    (this->time_minimal).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[v] = uVar2;
    (this->time_discover).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start[v] = uVar2;
    pvVar3 = (this->matrix).
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar4 = *(pointer *)
              ((long)&pvVar3[v].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl + 8);
    local_40 = v;
    for (puVar9 = *(pointer *)
                   &pvVar3[v].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl; puVar9 != puVar4; puVar9 = puVar9 + 1) {
      pEVar5 = (this->edges).super__Vector_base<Graph::Edge,_std::allocator<Graph::Edge>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = pEVar5[*puVar9].super_LightEdge.v;
      if (local_38 == local_40) {
        local_38 = pEVar5[*puVar9].super_LightEdge.u;
      }
      if (local_38 != backward) {
        if ((this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
            _M_impl.super__Vector_impl_data._M_start[local_38] == Grey) {
          puVar6 = (this->time_minimal).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (this->time_discover).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[local_38];
          uVar7 = puVar6[local_40];
          if (uVar8 < uVar7) {
            uVar7 = uVar8;
          }
          puVar6[local_40] = uVar7;
        }
        else {
          dfsForDeterm(this,local_38,timer,local_40);
          puVar6 = (this->time_minimal).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = puVar6[local_40];
          if (puVar6[local_38] < puVar6[local_40]) {
            uVar8 = puVar6[local_38];
          }
          puVar6[local_40] = uVar8;
          if ((this->time_discover).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[local_40] < puVar6[local_38]) {
            std::vector<Graph::LightEdge,std::allocator<Graph::LightEdge>>::
            emplace_back<unsigned_long&,unsigned_long&>
                      ((vector<Graph::LightEdge,std::allocator<Graph::LightEdge>> *)&this->bridges,
                       &local_38,&local_40);
          }
        }
      }
    }
    (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
    super__Vector_impl_data._M_start[local_40] = Black;
  }
  return;
}

Assistant:

void Graph::dfsForDeterm(std::uint64_t v, std::uint64_t &timer,
                         std::uint64_t backward) {
    if (colorMap[v] != Colors::White)
        return;

    colorMap[v] = Colors::Grey;
    time_discover[v] = time_minimal[v] = timer++;
    for (auto index : matrix[v]) {
        auto &e = edges[index];
        std::uint64_t vertex = (e.v == v) ? e.u : e.v;

        if (vertex == backward)
            continue;
        if (colorMap[vertex] == Colors::Grey) {
            time_minimal[v] = std::min(time_minimal[v], time_discover[vertex]);
        } else {
            Graph::dfsForDeterm(vertex, timer, v);
            time_minimal[v] = std::min(time_minimal[v], time_minimal[vertex]);
            if (time_minimal[vertex] > time_discover[v])
                bridges.emplace_back(vertex, v);
        }
    }
    colorMap[v] = Colors::Black;
}